

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cc
# Opt level: O0

int CRYPTO_BUFFER_cmp(CRYPTO_BUFFER *a,CRYPTO_BUFFER *b)

{
  CRYPTO_BUFFER *b_local;
  CRYPTO_BUFFER *a_local;
  
  if (a->pool == (CRYPTO_BUFFER_POOL *)0x0) {
    __assert_fail("a->pool != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool.cc"
                  ,0x24,"int CRYPTO_BUFFER_cmp(const CRYPTO_BUFFER *, const CRYPTO_BUFFER *)");
  }
  if (a->pool == b->pool) {
    if (a->len == b->len) {
      a_local._4_4_ = OPENSSL_memcmp(a->data,b->data,a->len);
    }
    else {
      a_local._4_4_ = 1;
    }
    return a_local._4_4_;
  }
  __assert_fail("a->pool == b->pool",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pool/pool.cc"
                ,0x25,"int CRYPTO_BUFFER_cmp(const CRYPTO_BUFFER *, const CRYPTO_BUFFER *)");
}

Assistant:

static int CRYPTO_BUFFER_cmp(const CRYPTO_BUFFER *a, const CRYPTO_BUFFER *b) {
  // Only |CRYPTO_BUFFER|s from the same pool have compatible hashes.
  assert(a->pool != NULL);
  assert(a->pool == b->pool);
  if (a->len != b->len) {
    return 1;
  }
  return OPENSSL_memcmp(a->data, b->data, a->len);
}